

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O3

void __thiscall
HighsConflictPool::addReconvergenceCut
          (HighsConflictPool *this,HighsDomain *domain,
          set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
          *reconvergenceFrontier,HighsDomainChange *reconvergenceDomchg)

{
  pointer puVar1;
  undefined8 *puVar2;
  _Rb_tree_color _Var3;
  pointer piVar4;
  pointer ppVar5;
  pointer ppVar6;
  int *piVar7;
  pointer ppCVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  int iVar12;
  const_iterator cVar13;
  const_iterator __position;
  long lVar14;
  int iVar15;
  pointer pHVar16;
  int iVar17;
  _Rb_tree_header *p_Var18;
  pointer ppCVar19;
  HighsDomainChange *pHVar20;
  ulong extraout_XMM0_Qb;
  HighsDomainChange HVar21;
  HighsInt end;
  HighsInt start;
  int local_60;
  int local_5c;
  HighsDomainChange *local_58;
  _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
  *local_48;
  ulong uStack_40;
  int local_34;
  
  iVar12 = (int)(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_node_count + 1;
  local_58 = reconvergenceDomchg;
  if (((this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var10 = (this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var10 != (_Base_ptr)0x0)) {
    p_Var18 = &(this->freeSpaces_)._M_t._M_impl.super__Rb_tree_header;
    cVar13._M_node = &p_Var18->_M_header;
    do {
      if (((int)p_Var10[1]._M_color < iVar12) ||
         ((lVar14 = 0x10, __position._M_node = p_Var10, (int)p_Var10[1]._M_color <= iVar12 &&
          (*(int *)&p_Var10[1].field_0x4 < -1)))) {
        lVar14 = 0x18;
        __position._M_node = cVar13._M_node;
      }
      p_Var10 = *(_Base_ptr *)((long)&p_Var10->_M_color + lVar14);
      cVar13._M_node = __position._M_node;
    } while (p_Var10 != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)__position._M_node != p_Var18) {
      _Var3 = __position._M_node[1]._M_color;
      iVar15 = *(int *)&__position._M_node[1].field_0x4;
      local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&this->freeSpaces_;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::erase_abi_cxx11_((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                          *)&this->freeSpaces_,__position);
      local_60 = iVar15 + iVar12;
      iVar17 = _Var3 - iVar12;
      local_5c = iVar15;
      if (iVar17 != 0 && iVar12 <= (int)_Var3) {
        local_34 = iVar17;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_emplace_unique<int,int&>(local_48,&local_34,&local_60);
      }
      goto LAB_0027ab74;
    }
  }
  iVar15 = (int)((ulong)((long)(this->conflictEntries_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->conflictEntries_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
  local_60 = iVar12 + iVar15;
  local_5c = iVar15;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::resize
            (&this->conflictEntries_,(long)local_60);
LAB_0027ab74:
  piVar4 = (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar4) {
    ppVar5 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppVar6 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &this->conflictRanges_,&local_5c,&local_60);
    std::vector<short,_std::allocator<short>_>::resize
              (&this->ages_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->modification_,
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->conflictRanges_).
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
    iVar12 = (int)((ulong)((long)ppVar5 - (long)ppVar6) >> 3);
    lVar14 = (long)iVar12;
  }
  else {
    iVar12 = piVar4[-1];
    (this->deletedConflicts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4 + -1;
    lVar14 = (long)iVar12;
    ppVar5 = (this->conflictRanges_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar5[lVar14].first = iVar15;
    ppVar5[lVar14].second = local_60;
  }
  puVar1 = (this->modification_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + lVar14;
  *puVar1 = *puVar1 + 1;
  (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar14] = 0;
  piVar7 = (this->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar7 = *piVar7 + 1;
  lVar14 = (long)local_5c;
  HVar21 = HighsDomain::flip(domain,local_58);
  pHVar16 = (this->conflictEntries_).
            super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar16[lVar14].boundval = HVar21.boundval;
  pHVar16 = pHVar16 + lVar14;
  pHVar16->column = (int)HVar21._8_8_;
  pHVar16->boundtype = (int)((ulong)HVar21._8_8_ >> 0x20);
  local_58 = (HighsDomainChange *)HighsDomain::feastol(domain);
  p_Var11 = (reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var18 = &(reconvergenceFrontier->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var18) {
    pHVar16 = (this->conflictEntries_).
              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_48 = (_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                *)((ulong)local_58 ^ 0x8000000000000000);
    uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
    lVar14 = lVar14 * 0x10;
    do {
      p_Var9 = p_Var11[1]._M_left;
      puVar2 = (undefined8 *)((long)&pHVar16[1].boundval + lVar14);
      *puVar2 = p_Var11[1]._M_parent;
      puVar2[1] = p_Var9;
      pHVar16 = (this->conflictEntries_).
                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((domain->mipsolver->model_->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[*(int *)((long)&pHVar16[1].column + lVar14)] ==
          kContinuous) {
        pHVar20 = local_58;
        if (*(int *)((long)&pHVar16[1].boundtype + lVar14) != 0) {
          pHVar20 = (HighsDomainChange *)local_48;
        }
        *(double *)((long)&pHVar16[1].boundval + lVar14) =
             (double)pHVar20 + *(double *)((long)&pHVar16[1].boundval + lVar14);
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      lVar14 = lVar14 + 0x10;
    } while ((_Rb_tree_header *)p_Var11 != p_Var18);
  }
  ppCVar8 = (this->propagationDomains).
            super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar19 = (this->propagationDomains).
                  super__Vector_base<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppCVar19 != ppCVar8;
      ppCVar19 = ppCVar19 + 1) {
    HighsDomain::ConflictPoolPropagation::conflictAdded(*ppCVar19,iVar12);
  }
  return;
}

Assistant:

void HighsConflictPool::addReconvergenceCut(
    const HighsDomain& domain,
    const std::set<HighsDomain::ConflictSet::LocalDomChg>&
        reconvergenceFrontier,
    const HighsDomainChange& reconvergenceDomchg) {
  HighsInt conflictIndex;
  HighsInt start;
  HighsInt end;
  HighsInt conflictLen = reconvergenceFrontier.size() + 1;
  std::set<std::pair<HighsInt, HighsInt>>::iterator it;
  if (freeSpaces_.empty() ||
      (it = freeSpaces_.lower_bound(
           std::make_pair(conflictLen, HighsInt{-1}))) == freeSpaces_.end()) {
    start = conflictEntries_.size();
    end = start + conflictLen;

    conflictEntries_.resize(end);
  } else {
    std::pair<HighsInt, HighsInt> freeslot = *it;
    freeSpaces_.erase(it);

    start = freeslot.second;
    end = start + conflictLen;
    // if the space was not completely occupied, we register the remainder of
    // it again in the priority queue
    if (freeslot.first > conflictLen) {
      freeSpaces_.emplace(freeslot.first - conflictLen, end);
    }
  }

  // register the range of entries for this conflict with a reused or a new
  // index
  if (deletedConflicts_.empty()) {
    conflictIndex = conflictRanges_.size();
    conflictRanges_.emplace_back(start, end);
    ages_.resize(conflictRanges_.size());
    modification_.resize(conflictRanges_.size());
  } else {
    conflictIndex = deletedConflicts_.back();
    deletedConflicts_.pop_back();
    conflictRanges_[conflictIndex].first = start;
    conflictRanges_[conflictIndex].second = end;
  }

  modification_[conflictIndex] += 1;
  ages_[conflictIndex] = 0;
  ageDistribution_[ages_[conflictIndex]] += 1;

  HighsInt i = start;
  const std::vector<HighsDomainChange>& domchgStack_ =
      domain.getDomainChangeStack();
  assert(i < end);
  conflictEntries_[i++] = domain.flip(reconvergenceDomchg);
  double feastol = domain.feastol();
  for (const HighsDomain::ConflictSet::LocalDomChg& domchg :
       reconvergenceFrontier) {
    assert(i < end);
    assert(domchg.pos >= 0);
    assert(domchg.pos < (HighsInt)domchgStack_.size());
    conflictEntries_[i] = domchg.domchg;
    if (domain.variableType(conflictEntries_[i].column) ==
        HighsVarType::kContinuous) {
      if (conflictEntries_[i].boundtype == HighsBoundType::kLower)
        conflictEntries_[i].boundval += feastol;
      else
        conflictEntries_[i].boundval -= feastol;
    }
    ++i;
  }

  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictAdded(conflictIndex);
}